

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

int __thiscall QObjectPrivate::signalIndex(QObjectPrivate *this,char *signalName,QMetaObject **meta)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  QByteArrayView name;
  QMetaObject *base;
  QMetaObject *local_188;
  undefined1 local_180 [344];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (**((this->super_QObjectData).q_ptr)->_vptr_QObject)();
  local_188 = (QMetaObject *)CONCAT44(extraout_var,iVar1);
  memset((QArgumentType *)(local_180 + 0x18),0xaa,0x140);
  local_180._0_8_ = 10;
  local_180._8_8_ = 0;
  local_180._16_8_ = (QArgumentType *)(local_180 + 0x18);
  name = QMetaObjectPrivate::decodeMethodSignature(signalName,(QArgumentTypeArray *)local_180);
  iVar1 = QMetaObjectPrivate::indexOfSignalRelative
                    (&local_188,name,local_180._8_4_,(QArgumentType *)local_180._16_8_);
  if (-1 < iVar1) {
    iVar2 = QMetaObjectPrivate::originalClone(local_188,iVar1);
    if (meta != (QMetaObject **)0x0) {
      *meta = local_188;
    }
    iVar1 = QMetaObjectPrivate::signalOffset(local_188);
    iVar1 = iVar1 + iVar2;
  }
  QVarLengthArray<QArgumentType,_10LL>::~QVarLengthArray
            ((QVarLengthArray<QArgumentType,_10LL> *)local_180);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QObjectPrivate::signalIndex(const char *signalName,
                                const QMetaObject **meta) const
{
    Q_Q(const QObject);
    const QMetaObject *base = q->metaObject();
    Q_ASSERT(QMetaObjectPrivate::get(base)->revision >= 7);
    QArgumentTypeArray types;
    QByteArrayView name = QMetaObjectPrivate::decodeMethodSignature(signalName, types);
    int relative_index = QMetaObjectPrivate::indexOfSignalRelative(
            &base, name, types.size(), types.constData());
    if (relative_index < 0)
        return relative_index;
    relative_index = QMetaObjectPrivate::originalClone(base, relative_index);
    if (meta)
        *meta = base;
    return relative_index + QMetaObjectPrivate::signalOffset(base);
}